

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::AsmJsByteCodeWriter::AsmReg9
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = TryWriteAsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,R0,R1,R2,R3,R4,R5,R6,R7,R8);
  if (!bVar2) {
    bVar2 = TryWriteAsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,op,R0,R1,R2,R3,R4,R5,R6,R7,R8);
    if (!bVar2) {
      bVar2 = TryWriteAsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,op,R0,R1,R2,R3,R4,R5,R6,R7,R8);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                    ,0x1ff,"(success)","success");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmReg9(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8)
    {
        MULTISIZE_LAYOUT_WRITE(AsmReg9, op, R0, R1, R2, R3, R4, R5, R6, R7, R8);
    }